

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamRandomAccessController_p.cpp
# Opt level: O3

void __thiscall
BamTools::Internal::BamRandomAccessController::AdjustRegion
          (BamRandomAccessController *this,int *referenceCount)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int currentId;
  int local_1c;
  
  if (this->m_index != (BamIndex *)0x0) {
    this->m_hasAlignmentsInRegion = false;
    local_1c = (this->m_region).LeftRefID;
    iVar2 = (this->m_region).RightRefID;
    iVar3 = *referenceCount + -1;
    if (0 < (this->m_region).RightPosition) {
      iVar3 = iVar2;
    }
    if (iVar2 < 0) {
      iVar3 = *referenceCount + -1;
    }
    if (local_1c <= iVar3) {
      do {
        iVar2 = (*this->m_index->_vptr_BamIndex[3])(this->m_index,&local_1c);
        this->m_hasAlignmentsInRegion = SUB41(iVar2,0);
        if (SUB41(iVar2,0) != false) {
          if (local_1c == (this->m_region).LeftRefID) {
            return;
          }
          (this->m_region).LeftRefID = local_1c;
          (this->m_region).LeftPosition = 0;
          return;
        }
        bVar1 = local_1c < iVar3;
        local_1c = local_1c + 1;
      } while (bVar1);
    }
  }
  return;
}

Assistant:

void BamRandomAccessController::AdjustRegion(const int& referenceCount)
{

    // skip if no index available
    if (m_index == 0) return;

    // see if any references in region have alignments
    m_hasAlignmentsInRegion = false;
    int currentId = m_region.LeftRefID;
    const int rightBoundRefId =
        (m_region.isRightBoundSpecified() ? m_region.RightRefID : referenceCount - 1);
    while (currentId <= rightBoundRefId) {
        m_hasAlignmentsInRegion = m_index->HasAlignments(currentId);
        if (m_hasAlignmentsInRegion) break;
        ++currentId;
    }

    // if no data found on any reference in region
    if (!m_hasAlignmentsInRegion) return;

    // if left bound of desired region had no data, use first reference that had data
    // otherwise, leave requested region as-is
    if (currentId != m_region.LeftRefID) {
        m_region.LeftRefID = currentId;
        m_region.LeftPosition = 0;
    }
}